

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Reset(ByteCodeWriter *this)

{
  Type_conflict pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ArenaAllocator *pAVar5;
  Type_conflict *ppSVar6;
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  long *plVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  code *local_120;
  code *local_f8;
  code *local_d0;
  ByteCodeWriter *this_local;
  FreeFuncType freeFunc_2;
  NodeBase *next_2;
  NodeBase *current_2;
  FreeFuncType freeFunc_1;
  NodeBase *next_1;
  NodeBase *current_1;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  this->isInUse = false;
  if ((this->isInitialized & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x10d,"(isInitialized)","isInitialized");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Data::Reset(&this->m_byteCodeData);
  Data::Reset(&this->m_auxiliaryData);
  Data::Reset(&this->m_auxContextData);
  this->lastOpcode = FunctionEntry;
  UpdateNextBranchIslandOffset(this,0,0);
  JsUtil::
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Clear(this->m_longJumpOffsets);
  JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Clear(this->m_labelOffsets);
  JsUtil::
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Clear(this->m_jumpOffsets);
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Clear(this->m_loopHeaders);
  pSVar7 = &this->rootObjectLoadInlineCacheOffsets;
  pAVar5 = JsUtil::
           List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::GetAllocator(this->m_labelOffsets);
  ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&pSVar7->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar6;
  while (bVar3 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar7,next),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar1 = *ppSVar6;
    local_d0 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_unsigned_long>::GetFreeFunc
                                 ();
    plVar8 = (long *)((long)&(pAVar5->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_d0 & 1) != 0) {
      local_d0 = *(code **)(local_d0 + *plVar8 + -1);
    }
    (*local_d0)(plVar8,next,0x10);
    next = pSVar1;
  }
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Reset(pSVar7);
  pSVar7 = &this->rootObjectStoreInlineCacheOffsets;
  pAVar5 = JsUtil::
           List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::GetAllocator(this->m_labelOffsets);
  ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&pSVar7->super_SListNodeBase<Memory::ArenaAllocator>);
  next_1 = *ppSVar6;
  while (bVar3 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar7,next_1),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next(next_1);
    pSVar1 = *ppSVar6;
    local_f8 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_unsigned_long>::GetFreeFunc
                                 ();
    plVar8 = (long *)((long)&(pAVar5->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX_00);
    if (((ulong)local_f8 & 1) != 0) {
      local_f8 = *(code **)(local_f8 + *plVar8 + -1);
    }
    (*local_f8)(plVar8,next_1,0x10);
    next_1 = pSVar1;
  }
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Reset(pSVar7);
  pSVar7 = &this->rootObjectLoadMethodInlineCacheOffsets;
  pAVar5 = JsUtil::
           List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::GetAllocator(this->m_labelOffsets);
  ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&pSVar7->super_SListNodeBase<Memory::ArenaAllocator>);
  next_2 = *ppSVar6;
  while (bVar3 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar7,next_2),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next(next_2);
    pSVar1 = *ppSVar6;
    local_120 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_unsigned_long>::
                        GetFreeFunc();
    plVar8 = (long *)((long)&(pAVar5->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX_01);
    if (((ulong)local_120 & 1) != 0) {
      local_120 = *(code **)(local_120 + *plVar8 + -1);
    }
    (*local_120)(plVar8,next_2,0x10);
    next_2 = pSVar1;
  }
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Reset(pSVar7);
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::ResetNoDelete(this->callRegToLdFldCacheIndexMap);
  this->m_pMatchingNode = (ParseNode *)0x0;
  this->m_matchingNodeRefCount = 0;
  this->m_functionWrite = (FunctionBody *)0x0;
  this->m_byteCodeCount = 0;
  this->m_byteCodeWithoutLDACount = 0;
  this->m_byteCodeInLoopCount = 0;
  this->m_loopNest = 0;
  this->m_currentDebuggerScope = (DebuggerScope *)0x0;
  return;
}

Assistant:

void ByteCodeWriter::Reset()
    {
        DebugOnly(isInUse = false);
        Assert(isInitialized);
        m_byteCodeData.Reset();
        m_auxiliaryData.Reset();
        m_auxContextData.Reset();
#ifdef BYTECODE_BRANCH_ISLAND
        lastOpcode = Js::OpCode::FunctionEntry;
        this->UpdateNextBranchIslandOffset(0, 0);
        m_longJumpOffsets->Clear();
#endif
        m_labelOffsets->Clear();
        m_jumpOffsets->Clear();
        m_loopHeaders->Clear();
        rootObjectLoadInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        rootObjectStoreInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        rootObjectLoadMethodInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        callRegToLdFldCacheIndexMap->ResetNoDelete();
        m_pMatchingNode = nullptr;
        m_matchingNodeRefCount = 0;
        m_functionWrite = nullptr;
        m_byteCodeCount = 0;
        m_byteCodeWithoutLDACount = 0;
        m_byteCodeInLoopCount = 0;
        m_loopNest = 0;
        m_currentDebuggerScope = nullptr;
    }